

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ipoint.cpp
# Opt level: O0

bool __thiscall ON_4iRect::IntersectRect(ON_4iRect *this,ON_4iRect *r1,ON_4iRect *r2)

{
  int iVar1;
  ON_4iRect *r2_local;
  ON_4iRect *r1_local;
  ON_4iRect *this_local;
  
  iVar1 = ON_Max(r1->left,r2->left);
  this->left = iVar1;
  iVar1 = ON_Min(r1->right,r2->right);
  this->right = iVar1;
  if (this->left < this->right) {
    iVar1 = ON_Max(r1->top,r2->top);
    this->top = iVar1;
    iVar1 = ON_Min(r1->bottom,r2->bottom);
    this->bottom = iVar1;
    if (this->top < this->bottom) {
      return true;
    }
  }
  SetRectEmpty(this);
  return false;
}

Assistant:

bool ON_4iRect::IntersectRect(const ON_4iRect * r1, const ON_4iRect * r2)
{
  left = ON_Max(r1->left, r2->left);
  right = ON_Min(r1->right, r2->right);
  if (right > left)
  {
    top = ON_Max(r1->top, r2->top);
    bottom = ON_Min(r1->bottom, r2->bottom);
    if (bottom > top)
      return true;
  }

  // degenerate rectangle at this point...
  SetRectEmpty();
  return false;
}